

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

bool EqualNode::ParameterToLong(char *param,long *outResult)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  int __base;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  char *pEnd;
  
  cVar1 = *param;
  sVar3 = strlen(param);
  str._M_str = param;
  str._M_len = sVar3;
  bVar2 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0x5f9f30);
  if (bVar2) {
LAB_004148cc:
    param = param + 2;
  }
  else {
    sVar3 = strlen(param);
    str_00._M_str = param;
    str_00._M_len = sVar3;
    bVar2 = cmHasLiteralPrefix<3ul>(str_00,(char (*) [3])0x5f9f34);
    if (bVar2) goto LAB_004148cc;
    sVar3 = strlen(param);
    str_01._M_str = param;
    str_01._M_len = sVar3;
    bVar2 = cmHasLiteralPrefix<4ul>(str_01,(char (*) [4])"-0b");
    if (!bVar2) {
      sVar3 = strlen(param);
      str_02._M_str = param;
      str_02._M_len = sVar3;
      bVar2 = cmHasLiteralPrefix<4ul>(str_02,(char (*) [4])"-0B");
      if (!bVar2) {
        sVar3 = strlen(param);
        str_03._M_str = param;
        str_03._M_len = sVar3;
        bVar2 = cmHasLiteralPrefix<4ul>(str_03,(char (*) [4])"+0b");
        if (!bVar2) {
          sVar3 = strlen(param);
          str_04._M_str = param;
          str_04._M_len = sVar3;
          bVar2 = cmHasLiteralPrefix<4ul>(str_04,(char (*) [4])"+0B");
          __base = 0;
          if (!bVar2) goto LAB_00414953;
        }
      }
    }
    param = param + 3;
  }
  __base = 2;
LAB_00414953:
  lVar4 = strtol(param,&pEnd,__base);
  if (((pEnd != param) && (*pEnd == '\0')) && (piVar5 = __errno_location(), *piVar5 != 0x22)) {
    lVar6 = -lVar4;
    if (lVar4 < 1) {
      lVar6 = lVar4;
    }
    if (cVar1 != '-') {
      lVar6 = lVar4;
    }
    *outResult = lVar6;
    return true;
  }
  return false;
}

Assistant:

static bool ParameterToLong(const char* param, long* outResult)
  {
    const char isNegative = param[0] == '-';

    int base = 0;
    if (cmHasLiteralPrefix(param, "0b") || cmHasLiteralPrefix(param, "0B")) {
      base = 2;
      param += 2;
    } else if (cmHasLiteralPrefix(param, "-0b") ||
               cmHasLiteralPrefix(param, "-0B") ||
               cmHasLiteralPrefix(param, "+0b") ||
               cmHasLiteralPrefix(param, "+0B")) {
      base = 2;
      param += 3;
    }

    char* pEnd;
    long result = strtol(param, &pEnd, base);
    if (pEnd == param || *pEnd != '\0' || errno == ERANGE) {
      return false;
    }
    if (isNegative && result > 0) {
      result *= -1;
    }
    *outResult = result;
    return true;
  }